

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall OpenMD::NotEmptyConstraint::NotEmptyConstraint(NotEmptyConstraint *this)

{
  string *in_RDI;
  
  ParamConstraintFacade<OpenMD::NotEmptyConstraint>::ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::NotEmptyConstraint> *)0x227438);
  std::__cxx11::string::operator=(in_RDI,"nonempty");
  return;
}

Assistant:

NotEmptyConstraint() { description_ = "nonempty"; }